

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

void __thiscall Func::DisableCanDoInlineArgOpt(Func *this)

{
  Func *local_18;
  Func *curFunc;
  Func *this_local;
  
  for (local_18 = this; local_18 != (Func *)0x0; local_18 = GetParentFunc(local_18)) {
    *(uint *)&local_18->field_0x240 = *(uint *)&local_18->field_0x240 & 0xfffff7ff;
    *(uint *)&local_18->field_0x240 = *(uint *)&local_18->field_0x240 & 0xfffffffd;
    local_18->frameInfo = (InlineeFrameInfo *)0x0;
  }
  return;
}

Assistant:

void               DisableCanDoInlineArgOpt()
    {
                        Func* curFunc = this;
                        while (curFunc)
                        {
                            curFunc->m_canDoInlineArgsOpt = false;
                            curFunc->m_hasInlineArgsOpt = false;
                            curFunc->frameInfo = nullptr;
                            curFunc = curFunc->GetParentFunc();
                        }
    }